

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall Parser::FinishFncNode(Parser *this,ParseNodeFnc *pnodeFnc,bool fAllowIn)

{
  uint uVar1;
  ParseNodeFnc *pPVar2;
  uint *puVar3;
  int32 *piVar4;
  size_t sVar5;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool fAwaitIsKeywordRegion;
  charcount_t cVar10;
  undefined4 *puVar11;
  Scanner_t *pSVar12;
  ScriptConfiguration *this_00;
  bool local_71;
  bool local_61;
  size_t cbLim;
  charcount_t ichLim;
  bool fPreviousAwaitIsKeyword;
  bool fPreviousYieldIsKeyword;
  bool fMethod;
  bool fLambda;
  int32 *pAstSizeSave;
  uint *pnestedCountSave;
  ParseNodeFnc *pnodeFncSave;
  LocalFunctionId *pLStack_28;
  LocalFunctionId tempNextFunctionId;
  LocalFunctionId *nextFunctionIdSave;
  ParseNodeFnc *pPStack_18;
  bool fAllowIn_local;
  ParseNodeFnc *pnodeFnc_local;
  Parser *this_local;
  
  nextFunctionIdSave._7_1_ = fAllowIn;
  pPStack_18 = pnodeFnc;
  pnodeFnc_local = (ParseNodeFnc *)this;
  if (pnodeFnc == (ParseNodeFnc *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x1cfb,"(pnodeFnc)","pnodeFnc");
    if (!bVar7) {
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pLStack_28 = this->m_nextFunctionId;
  pnodeFncSave._4_4_ = pPStack_18->functionId + 1;
  this->m_nextFunctionId = (LocalFunctionId *)((long)&pnodeFncSave + 4);
  pPVar2 = this->m_currentNodeFunc;
  puVar3 = this->m_pnestedCount;
  piVar4 = this->m_pCurrentAstSize;
  this->m_currentNodeFunc = pPStack_18;
  this->m_pCurrentAstSize = &pPStack_18->astSize;
  pPStack_18->nestedCount = 0;
  this->m_pnestedCount = &pPStack_18->nestedCount;
  bVar7 = ParseNodeFnc::IsLambda(pPStack_18);
  bVar8 = ParseNodeFnc::IsMethod(pPStack_18);
  if (pPStack_18->pnodeName == (ParseNodeVar *)0x0) {
    pSVar12 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::SetCurrentCharacter
              (pSVar12,(pPStack_18->super_ParseNode).ichMin,pPStack_18->lineNumber);
    if (bVar8) {
      do {
        while( true ) {
          pSVar12 = GetScanner(this);
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar12);
          if ((this->m_token).tk != tkLBrack) break;
          pSVar12 = GetScanner(this);
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar12);
          ParseExpr<false>(this,0,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                           (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
          if ((this->m_token).tk != tkRBrack) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x1d2a,"(m_token.tk == tkRBrack)","m_token.tk == tkRBrack");
            if (!bVar9) {
              pcVar6 = (code *)invalidInstructionException();
              (*pcVar6)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        }
      } while ((this->m_token).tk != tkLParen);
    }
    else {
      bVar9 = ParseNodeFnc::IsAccessor(pPStack_18);
      if (bVar9) {
        pSVar12 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(pSVar12);
      }
      else if (!bVar7) {
        while( true ) {
          while( true ) {
            pSVar12 = GetScanner(this);
            Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar12);
            bVar9 = CheckContextualKeyword(this,(this->wellKnownPropertyPids).async);
            if (!bVar9) break;
            bVar9 = ParseNodeFnc::IsAsync(pPStack_18);
            if (!bVar9) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                 ,0x1d41,"(pnodeFnc->IsAsync())","pnodeFnc->IsAsync()");
              if (!bVar9) {
                pcVar6 = (code *)invalidInstructionException();
                (*pcVar6)();
              }
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 0;
            }
          }
          if ((this->m_token).tk == tkFUNCTION) break;
          if (((this->m_token).tk != tkLParen) && ((this->m_token).tk != tkStar)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x1d49,"(m_token.tk == tkLParen || m_token.tk == tkStar)",
                               "m_token.tk == tkLParen || m_token.tk == tkStar");
            if (!bVar9) {
              pcVar6 = (code *)invalidInstructionException();
              (*pcVar6)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        }
      }
    }
  }
  else {
    pSVar12 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::SetCurrentCharacter
              (pSVar12,(pPStack_18->pnodeName->super_ParseNode).ichLim,pPStack_18->lineNumber);
  }
  pSVar12 = GetScanner(this);
  local_61 = false;
  if (pPStack_18 != (ParseNodeFnc *)0x0) {
    local_61 = ParseNodeFnc::IsGenerator(pPStack_18);
  }
  bVar9 = Scanner<UTF8EncodingPolicyBase<false>_>::SetYieldIsKeywordRegion(pSVar12,local_61);
  pSVar12 = GetScanner(this);
  local_71 = false;
  if (pPStack_18 != (ParseNodeFnc *)0x0) {
    local_71 = ParseNodeFnc::IsAsync(pPStack_18);
  }
  fAwaitIsKeywordRegion =
       Scanner<UTF8EncodingPolicyBase<false>_>::SetAwaitIsKeywordRegion(pSVar12,local_71);
  if (!bVar8) {
    pSVar12 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar12);
  }
  if ((this->m_token).tk == tkStar) {
    bVar8 = ParseNodeFnc::IsGenerator(pPStack_18);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1d5b,"(pnodeFnc->IsGenerator())","pnodeFnc->IsGenerator()");
      if (!bVar8) {
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    pSVar12 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(pSVar12);
  }
  if ((bVar7) && (bVar8 = CheckContextualKeyword(this,(this->wellKnownPropertyPids).async), bVar8))
  {
    bVar8 = ParseNodeFnc::IsAsync(pPStack_18);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1d60,"(pnodeFnc->IsAsync())","pnodeFnc->IsAsync()");
      if (!bVar8) {
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    pSVar12 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(pSVar12);
  }
  if (((this->m_token).tk != tkLParen) && ((!bVar7 || ((this->m_token).tk != tkID)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x1d63,"(m_token.tk == tkLParen || (fLambda && m_token.tk == tkID))",
                       "m_token.tk == tkLParen || (fLambda && m_token.tk == tkID)");
    if (!bVar8) {
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pSVar12 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(pSVar12);
  if (((this->m_token).tk != tkRParen) && ((this->m_token).tk != tkDArrow)) {
    do {
      do {
        if ((this->m_token).tk == tkEllipsis) {
          pSVar12 = GetScanner(this);
          Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(pSVar12);
        }
        if ((this->m_token).tk == tkID) {
          pSVar12 = GetScanner(this);
          Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(pSVar12);
          if ((this->m_token).tk == tkAsg) {
            pSVar12 = GetScanner(this);
            Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar12);
            ParseExpr<false>(this,1,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                             (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
          }
        }
        else {
          bVar8 = IsPossiblePatternStart(this);
          if (bVar8) {
            ParseDestructuredLiteralWithScopeSave(this,tkLET,false,false,DIC_None,true);
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x1d80,"(false)",
                               "Unexpected identifier prefix while fast-scanning formals");
            if (!bVar8) {
              pcVar6 = (code *)invalidInstructionException();
              (*pcVar6)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        }
        if ((this->m_token).tk != tkComma) goto LAB_01528d7e;
        pSVar12 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(pSVar12);
      } while ((this->m_token).tk != tkRParen);
      this_00 = Js::ScriptContext::GetConfig(this->m_scriptContext);
      bVar8 = Js::ScriptConfiguration::IsES7TrailingCommaEnabled(this_00);
    } while (!bVar8);
  }
LAB_01528d7e:
  if ((this->m_token).tk == tkRParen) {
    pSVar12 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar12);
  }
  if ((bVar7) && ((this->m_token).tk == tkDArrow)) {
    pSVar12 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar12);
  }
  uVar1 = (pPStack_18->super_ParseNode).ichLim;
  sVar5 = pPStack_18->cbLim;
  FinishFncDecl(this,pPStack_18,(LPCOLESTR)0x0,bVar7,false,(bool)(nextFunctionIdSave._7_1_ & 1));
  if ((pPStack_18->super_ParseNode).ichLim != uVar1) {
    if (uVar1 <= (pPStack_18->super_ParseNode).ichLim) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1da8,"(pnodeFnc->ichLim < ichLim)","pnodeFnc->ichLim < ichLim");
      if (!bVar7) {
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    pSVar12 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::SetCurrentCharacter
              (pSVar12,(pPStack_18->super_ParseNode).ichLim,0);
    while( true ) {
      pSVar12 = GetScanner(this);
      cVar10 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(pSVar12);
      if (cVar10 == uVar1) break;
      pSVar12 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(pSVar12);
      if ((this->m_token).tk != tkRParen) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x1dad,"(m_token.tk == tkRParen)","m_token.tk == tkRParen");
        if (!bVar7) {
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
    }
  }
  (pPStack_18->super_ParseNode).ichLim = uVar1;
  pPStack_18->cbLim = sVar5;
  this->m_currentNodeFunc = pPVar2;
  this->m_pCurrentAstSize = piVar4;
  this->m_pnestedCount = puVar3;
  if (this->m_pnestedCount == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x1db8,"(m_pnestedCount)","m_pnestedCount");
    if (!bVar7) {
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  if (pnodeFncSave._4_4_ != pPStack_18->deferredParseNextFunctionId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x1dba,"(tempNextFunctionId == pnodeFnc->deferredParseNextFunctionId)",
                       "tempNextFunctionId == pnodeFnc->deferredParseNextFunctionId");
    if (!bVar7) {
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  this->m_nextFunctionId = pLStack_28;
  pSVar12 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::SetYieldIsKeywordRegion(pSVar12,bVar9);
  pSVar12 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::SetAwaitIsKeywordRegion(pSVar12,fAwaitIsKeywordRegion);
  return;
}

Assistant:

void Parser::FinishFncNode(ParseNodeFnc * pnodeFnc, bool fAllowIn)
{
    AnalysisAssert(pnodeFnc);

    // Finish the AST for a function that was deferred earlier, but which we decided
    // to finish after the fact.
    // We assume that the name(s) and arg(s) have already got parse nodes, so
    // we just have to do the function body.

    // Save the current next function Id, and resume from the old one.
    Js::LocalFunctionId * nextFunctionIdSave = m_nextFunctionId;
    Js::LocalFunctionId tempNextFunctionId = pnodeFnc->functionId + 1;
    this->m_nextFunctionId = &tempNextFunctionId;

    ParseNodeFnc * pnodeFncSave = m_currentNodeFunc;
    uint *pnestedCountSave = m_pnestedCount;
    int32* pAstSizeSave = m_pCurrentAstSize;

    m_currentNodeFunc = pnodeFnc;
    m_pCurrentAstSize = &(pnodeFnc->astSize);

    pnodeFnc->nestedCount = 0;
    m_pnestedCount = &pnodeFnc->nestedCount;

    bool fLambda = pnodeFnc->IsLambda();
    bool fMethod = pnodeFnc->IsMethod();

    // Cue up the parser to the start of the function body.
    if (pnodeFnc->pnodeName)
    {
        // Skip the name(s).
        this->GetScanner()->SetCurrentCharacter(pnodeFnc->pnodeName->ichLim, pnodeFnc->lineNumber);
    }
    else
    {
        this->GetScanner()->SetCurrentCharacter(pnodeFnc->ichMin, pnodeFnc->lineNumber);

        if (fMethod)
        {
            // Method. Skip identifier name, computed property name, "async", "get", "set", and '*' or '(' characters.
            for (;;)
            {
                this->GetScanner()->Scan();
                // '[' character indicates a computed property name for this method. We should consume it.
                if (m_token.tk == tkLBrack)
                {
                    // We don't care what the name expr is.
                    this->GetScanner()->Scan();
                    ParseExpr<false>();
                    Assert(m_token.tk == tkRBrack);
                    continue;
                }
                // Quit scanning ahead when we reach a '(' character which opens the arg list.
                if (m_token.tk == tkLParen)
                {
                    break;
                }
            }
        }
        else if (pnodeFnc->IsAccessor())
        {
            // Getter/setter. The node text starts with the name, so eat that.
            this->GetScanner()->ScanNoKeywords();
        }
        else if (!fLambda)
        {
            // Anonymous function. Skip "async", "function", and '(' or '*' characters.
            for (;;)
            {
                this->GetScanner()->Scan();
                if (CheckContextualKeyword(wellKnownPropertyPids.async))
                {
                    Assert(pnodeFnc->IsAsync());
                    continue;
                }
                // Quit scanning ahead when we reach a 'function' keyword which precedes the arg list.
                if (m_token.tk == tkFUNCTION)
                {
                    break;
                }
                Assert(m_token.tk == tkLParen || m_token.tk == tkStar);
            }
        }
    }

    // switch scanner to treat 'yield' as keyword in generator functions
    // or as an identifier in non-generator functions
    bool fPreviousYieldIsKeyword = this->GetScanner()->SetYieldIsKeywordRegion(pnodeFnc && pnodeFnc->IsGenerator());
    bool fPreviousAwaitIsKeyword = this->GetScanner()->SetAwaitIsKeywordRegion(pnodeFnc && pnodeFnc->IsAsync());

    // Skip the arg list.
    if (!fMethod)
    {
        // If this is a method, we've already advanced to the '(' token.
        this->GetScanner()->Scan();
    }
    if (m_token.tk == tkStar)
    {
        Assert(pnodeFnc->IsGenerator());
        this->GetScanner()->ScanNoKeywords();
    }
    if (fLambda && CheckContextualKeyword(wellKnownPropertyPids.async))
    {
        Assert(pnodeFnc->IsAsync());
        this->GetScanner()->ScanNoKeywords();
    }
    Assert(m_token.tk == tkLParen || (fLambda && m_token.tk == tkID));
    this->GetScanner()->ScanNoKeywords();

    if (m_token.tk != tkRParen && m_token.tk != tkDArrow)
    {
        for (;;)
        {
            if (m_token.tk == tkEllipsis)
            {
                this->GetScanner()->ScanNoKeywords();
            }

            if (m_token.tk == tkID)
            {
                this->GetScanner()->ScanNoKeywords();

                if (m_token.tk == tkAsg)
                {
                    // Eat the default expression
                    this->GetScanner()->Scan();
                    ParseExpr<false>(koplCma);
                }
            }
            else if (IsPossiblePatternStart())
            {
                ParseDestructuredLiteralWithScopeSave(tkLET, false/*isDecl*/, false /*topLevel*/);
            }
            else
            {
                AssertMsg(false, "Unexpected identifier prefix while fast-scanning formals");
            }

            if (m_token.tk != tkComma)
            {
                break;
            }
            this->GetScanner()->ScanNoKeywords();

            if (m_token.tk == tkRParen && m_scriptContext->GetConfig()->IsES7TrailingCommaEnabled())
            {
                break;
            }
        }
    }

    if (m_token.tk == tkRParen)
    {
        this->GetScanner()->Scan();
    }
    if (fLambda && m_token.tk == tkDArrow)
    {
        this->GetScanner()->Scan();
    }

    // Finish the function body.
    {
        // Note that in IE8- modes, surrounding parentheses are considered part of function body. e.g. "( function x(){} )".
        // We lose that context here since we start from middle of function body. So save and restore source range info.
        const charcount_t ichLim = pnodeFnc->ichLim;
        const size_t cbLim = pnodeFnc->cbLim;

        this->FinishFncDecl(pnodeFnc, NULL, fLambda, /* skipCurlyBraces */ false, fAllowIn);

#if DBG
        // The pnode extent may not match the original extent.
        // We expect this to happen only when there are trailing ")"'s.
        // Consume them and make sure that's all we've got.
        if (pnodeFnc->ichLim != ichLim)
        {
            Assert(pnodeFnc->ichLim < ichLim);
            this->GetScanner()->SetCurrentCharacter(pnodeFnc->ichLim);
            while (this->GetScanner()->IchLimTok() != ichLim)
            {
                this->GetScanner()->ScanNoKeywords();
                Assert(m_token.tk == tkRParen);
            }
        }
#endif
        pnodeFnc->ichLim = ichLim;
        pnodeFnc->cbLim = cbLim;
    }

    m_currentNodeFunc = pnodeFncSave;
    m_pCurrentAstSize = pAstSizeSave;
    m_pnestedCount = pnestedCountSave;
    Assert(m_pnestedCount);

    Assert(tempNextFunctionId == pnodeFnc->deferredParseNextFunctionId);
    this->m_nextFunctionId = nextFunctionIdSave;

    this->GetScanner()->SetYieldIsKeywordRegion(fPreviousYieldIsKeyword);
    this->GetScanner()->SetAwaitIsKeywordRegion(fPreviousAwaitIsKeyword);
}